

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<float>(anon_unknown_0 *this,char *s,Parser *parser,float *val)

{
  long *plVar1;
  long *extraout_RAX;
  long *plVar2;
  float fVar3;
  allocator<char> local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  if ((s != (char *)0x0) && (val != (float *)0x0)) {
    local_88 = (long *)s;
    fVar3 = strtof_l(s,(char **)&local_88,ClassicLocale::instance_);
    *val = fVar3;
    if ((local_88 == (long *)s) || ((char)*local_88 != '\0')) {
      *val = 0.0;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,s,&local_89);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1b4253);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_58 = *plVar2;
        lStack_50 = plVar1[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar2;
        local_68 = (long *)*plVar1;
      }
      local_60 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_78 = *plVar2;
        lStack_70 = plVar1[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar2;
        local_88 = (long *)*plVar1;
      }
      local_80 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      Parser::Error((Parser *)this,(string *)parser);
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      plVar1 = local_38;
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
        plVar1 = extraout_RAX;
      }
    }
    else {
      *val = (float)(~-(uint)NAN(fVar3) & (uint)fVar3 | -(uint)NAN(fVar3) & 0x7fc00000);
      *(undefined2 *)this = 0;
      plVar1 = local_88;
    }
    return SUB82(plVar1,0);
  }
  __assert_fail("str && val",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
}

Assistant:

static bool compareFieldDefs(const FieldDef *a, const FieldDef *b) {
  auto a_id = atoi(a->attributes.Lookup("id")->constant.c_str());
  auto b_id = atoi(b->attributes.Lookup("id")->constant.c_str());
  return a_id < b_id;
}